

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cpp
# Opt level: O0

string * fineftp::Filesystem::cleanPath
                   (string *__return_storage_ptr__,string *path,bool windows_path,
                   char output_separator)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  reference __lhs;
  size_type sVar5;
  reference pbVar6;
  _Self local_330;
  _Self local_328;
  _Self local_320;
  iterator comp_it;
  stringstream path_ss;
  ostream local_308 [383];
  allocator local_189;
  int local_188;
  allocator local_181;
  value_type local_180;
  string local_160 [32];
  string local_140 [32];
  undefined1 local_120 [8];
  string this_component;
  size_t end;
  size_t start;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  size_t sep_pos;
  undefined1 local_90 [8];
  regex win_network_drive;
  regex win_local_drive;
  string absolute_root;
  allocator local_1b;
  char local_1a;
  byte local_19;
  char output_separator_local;
  string *psStack_18;
  bool windows_path_local;
  string *path_local;
  
  local_1a = output_separator;
  local_19 = windows_path;
  psStack_18 = path;
  path_local = __return_storage_ptr__;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,".",&local_1b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1b);
    return __return_storage_ptr__;
  }
  ::std::__cxx11::string::string
            ((string *)
             &win_local_drive._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  if ((local_19 & 1) == 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)psStack_18);
    if (*pcVar3 == '/') {
      ::std::__cxx11::string::operator=
                ((string *)
                 &win_local_drive._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,'/');
    }
  }
  else {
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &win_network_drive._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,"^[a-zA-Z]\\:",0x10);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_90,
               "^[/\\\\]{2}[^/\\\\]+",0x10);
    bVar1 = ::std::
            regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (psStack_18,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                       &win_network_drive._M_automaton.
                        super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,0);
    if (bVar1) {
      ::std::__cxx11::string::substr((ulong)&sep_pos,(ulong)psStack_18);
      ::std::__cxx11::string::operator=
                ((string *)
                 &win_local_drive._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(string *)&sep_pos);
      ::std::__cxx11::string::~string((string *)&sep_pos);
    }
    else {
      bVar1 = ::std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (psStack_18,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_90
                         ,0);
      if (bVar1) {
        ::std::__cxx11::string::find_first_of((char *)psStack_18,0x17e8ea);
        ::std::__cxx11::string::substr
                  ((ulong)&components.
                           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl._M_node._M_size,(ulong)psStack_18);
        ::std::__cxx11::string::operator=
                  ((string *)
                   &win_local_drive._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   (string *)
                   &components.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size);
        ::std::__cxx11::string::~string
                  ((string *)
                   &components.
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size);
      }
    }
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_90);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &win_network_drive._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  ::std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&start);
  uVar2 = ::std::__cxx11::string::size();
  lVar4 = ::std::__cxx11::string::size();
  if (lVar4 + 1U <= uVar2) {
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      end = ::std::__cxx11::string::size();
    }
    else {
      end = 0;
    }
    do {
      if ((local_19 & 1) == 0) {
        this_component.field_2._8_8_ =
             ::std::__cxx11::string::find_first_of((char *)psStack_18,0x17c004);
      }
      else {
        this_component.field_2._8_8_ =
             ::std::__cxx11::string::find_first_of((char *)psStack_18,0x17e8ea);
      }
      ::std::__cxx11::string::string((string *)local_120);
      if (this_component.field_2._8_8_ == -1) {
        ::std::__cxx11::string::substr((ulong)local_140,(ulong)psStack_18);
        ::std::__cxx11::string::operator=((string *)local_120,local_140);
        ::std::__cxx11::string::~string(local_140);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_160,(ulong)psStack_18);
        ::std::__cxx11::string::operator=((string *)local_120,local_160);
        ::std::__cxx11::string::~string(local_160);
      }
      uVar2 = ::std::__cxx11::string::empty();
      if (((uVar2 & 1) == 0) &&
         (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_120,"."), !bVar1)) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_120,"..");
        if (bVar1) {
          uVar2 = ::std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            bVar1 = ::std::__cxx11::
                    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&start);
            if (!bVar1) {
              ::std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&start);
            }
          }
          else {
            bVar1 = ::std::__cxx11::
                    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&start);
            if (!bVar1) {
              __lhs = ::std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&start);
              bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"..");
              if (bVar1) {
                ::std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&start);
                goto LAB_00153b1f;
              }
            }
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_180,"..",&local_181);
            ::std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&start,&local_180);
            ::std::__cxx11::string::~string((string *)&local_180);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
          }
        }
        else {
          ::std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&start,(value_type *)local_120);
        }
      }
LAB_00153b1f:
      if (this_component.field_2._8_8_ == -1) {
        local_188 = 2;
      }
      else {
        end = this_component.field_2._8_8_ + 1;
        local_188 = 0;
      }
      ::std::__cxx11::string::~string((string *)local_120);
    } while ((local_188 == 0) && (uVar2 = ::std::__cxx11::string::size(), end < uVar2));
    sVar5 = ::std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&start);
    if ((sVar5 == 0) && (uVar2 = ::std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,".",&local_189);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_189);
      local_188 = 1;
      goto LAB_00153d9d;
    }
  }
  ::std::__cxx11::stringstream::stringstream((stringstream *)&comp_it);
  ::std::operator<<(local_308,
                    (string *)
                    &win_local_drive._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  if (((local_19 & 1) != 0) && (uVar2 = ::std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    ::std::operator<<(local_308,local_1a);
  }
  local_320._M_node =
       (_List_node_base *)
       ::std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&start);
  while( true ) {
    local_328._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&start);
    bVar1 = ::std::operator!=(&local_320,&local_328);
    if (!bVar1) break;
    local_330._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&start);
    bVar1 = ::std::operator!=(&local_320,&local_330);
    if (bVar1) {
      ::std::operator<<(local_308,local_1a);
    }
    pbVar6 = ::std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_320);
    ::std::operator<<(local_308,(string *)pbVar6);
    ::std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_320,0);
  }
  ::std::__cxx11::stringstream::str();
  local_188 = 1;
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&comp_it);
LAB_00153d9d:
  ::std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&start);
  ::std::__cxx11::string::~string
            ((string *)
             &win_local_drive._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string cleanPath(const std::string& path, bool windows_path, const char output_separator)
  {
    if (path.empty())
    {
      return ".";
    }

    // Find the root for absolute paths

    std::string absolute_root;

    if (windows_path)
    {
      /* On Windows, a root folder can be:
       *    C:\
       *    //Host
       *    \\Host
       */

      std::regex win_local_drive("^[a-zA-Z]\\:");                // Local drive
      std::regex win_network_drive("^[/\\\\]{2}[^/\\\\]+");      // Network path starting with two slashes or backslashes followed by a hostname

      if (std::regex_search(path, win_local_drive))
      {
        // Windows local drive, consisting of drive-letter and colon
        absolute_root = path.substr(0, 2);
      }
      else if (std::regex_search(path, win_network_drive))
      {
        // Window network drive, consisting of \\ and hostname
        size_t sep_pos = path.find_first_of("/\\", 2);
        absolute_root = path.substr(0, sep_pos); // If no seperator was found, this will return the entire string
      }
    }
    else
    {
      // On Unix there is only one root and it is '/'
      if (path[0] == '/')
      {
        absolute_root = '/';
      }
    }

    // Split the path
    std::list<std::string> components;

    if (path.size() >= (absolute_root.size() + 1))
    {
      size_t start, end;
      
      if (absolute_root.empty())
        start = 0;
      else
        start = absolute_root.size();

      do
      {
        if (windows_path)
          end = path.find_first_of("/\\", start);
        else
          end = path.find_first_of("/", start);

        std::string this_component;
        if (end == std::string::npos)
          this_component = path.substr(start);
        else
          this_component = path.substr(start, end - start);
        
        // The components-stack that will increase and shrink depending on the folders and .. elements in the splitted path
        if (this_component.empty() || (this_component == "."))
        {
        }
        else if (this_component == "..")
        {
          if (!absolute_root.empty())
          {
            if (!components.empty())
            {
              // Move one folder up if we are not already at the root
              components.pop_back();
            }
          }
          else
          {
            if (!components.empty() && (components.back() != ".."))
            {
              // Move one folder up by removing it. We must not remove ".." elements that we were not able to resolve previously.
              components.pop_back();
            }
            else
            {
              components.push_back("..");
            }
          }
        }
        else
        {
          components.push_back(this_component);
        }

        if (end == std::string::npos)
          break;
        else
          start = end + 1;

      } while (start < path.size());

      // Join the components again
      if (components.size() == 0 && absolute_root.empty())
      {
          return ".";
      }
    }

    std::stringstream path_ss;
    path_ss << absolute_root;

    if (windows_path && !absolute_root.empty())
    {
      path_ss << output_separator; // The windows drive must be followed by a separator. When referencing a network drive.
    }

    auto comp_it = components.begin();
    while (comp_it != components.end())
    {
      if (comp_it != components.begin())
        path_ss << output_separator;
      
      path_ss << *comp_it;

      comp_it++;
    }

    return path_ss.str();
  }